

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Function * __thiscall Parser::function(Parser *this)

{
  ExprNode *this_00;
  Statements *statements;
  Function *this_01;
  undefined8 extraout_RAX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  params;
  Token closeParen;
  Token colon;
  Token openParen;
  Token def;
  allocator<char> local_359;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_340;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  Token local_248;
  Token local_1d8;
  Token local_168;
  Token local_f8;
  Token local_88;
  
  Tokenizer::getToken(&local_88,this->tokenizer);
  this_00 = variableID(this);
  Tokenizer::getToken(&local_f8,this->tokenizer);
  if (local_f8._symbol == '(') {
    parameterList_abi_cxx11_(&local_340,this);
    Tokenizer::getToken(&local_248,this->tokenizer);
    if (local_248._symbol == ')') {
      Tokenizer::getToken(&local_168,this->tokenizer);
      if (local_248._symbol == ')') {
        statements = suite(this);
        this_01 = (Function *)operator_new(0x88);
        ExprNode::token(&local_1d8,this_00);
        std::__cxx11::string::string((string *)&local_328,(string *)&local_1d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_358,&local_340);
        Function::Function(this_01,&local_328,&local_358,statements);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_358);
        std::__cxx11::string::~string((string *)&local_328);
        Token::~Token(&local_1d8);
        Token::~Token(&local_168);
        Token::~Token(&local_248);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_340);
        Token::~Token(&local_f8);
        Token::~Token(&local_88);
        return this_01;
      }
      goto LAB_001070a8;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,"Parser::functionDef",(allocator<char> *)&local_248);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,"Expected an ( sign, instead got",(allocator<char> *)&local_168)
    ;
    die(this,&local_268,&local_288,&local_f8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"Parser::functionDef",(allocator<char> *)&local_168);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"Expected an ) sign, instead got",(allocator<char> *)&local_1d8);
  die(this,&local_2a8,&local_2c8,&local_248);
LAB_001070a8:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"Parser::functionDef",(allocator<char> *)&local_1d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"Expected an : sign, instead got",&local_359);
  die(this,&local_2e8,&local_308,&local_168);
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&local_2e8);
  Token::~Token(&local_168);
  Token::~Token(&local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_340);
  Token::~Token(&local_f8);
  Token::~Token(&local_88);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Function *Parser::function(){
    Token def = tokenizer.getToken();
    ExprNode *id = variableID();
    Token openParen = tokenizer.getToken();
    if (!openParen.isOpenParen())
        die("Parser::functionDef", "Expected an ( sign, instead got", openParen);
    //Parameter List
    std::vector<std::string>params = parameterList();
    Token closeParen = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::functionDef", "Expected an ) sign, instead got", closeParen);
    Token colon = tokenizer.getToken();
    if (!closeParen.isCloseParen())
        die("Parser::functionDef", "Expected an : sign, instead got", colon);
    Statements *statements = suite();
    return new Function(id->token().getName(),params,statements);

}